

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

bool ImTui_ImplNcurses_NewFrame(void)

{
  int iVar1;
  ImGuiIO *pIVar2;
  ulong uVar3;
  ImGuiIO *pIVar4;
  ImGuiIO *pIVar5;
  byte bVar6;
  float fVar7;
  MEVENT event;
  int c;
  bool (*keysDown) [512];
  int screenSizeY;
  int screenSizeX;
  bool hasInput;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined2 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff23;
  undefined4 in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  ImGuiIO *in_stack_ffffffffffffff30;
  int local_44;
  int local_40;
  undefined1 local_3c [4];
  int local_38;
  int local_34;
  uint local_2c;
  int local_28;
  undefined4 local_24;
  bool *local_20;
  ImVec2 local_14;
  int local_c;
  int local_8;
  byte local_1;
  
  local_1 = 0;
  if (_stdscr == 0) {
    local_40 = -1;
  }
  else {
    local_40 = *(short *)(_stdscr + 4) + 1;
  }
  local_c = local_40;
  if (_stdscr == 0) {
    local_44 = -1;
  }
  else {
    local_44 = *(short *)(_stdscr + 6) + 1;
  }
  local_8 = local_44;
  ImVec2::ImVec2(&local_14,(float)local_44,(float)local_40);
  pIVar2 = ImGui::GetIO();
  pIVar2->DisplaySize = local_14;
  ImTui_ImplNcurses_NewFrame::input[2] = '\0';
  pIVar2 = ImGui::GetIO();
  local_20 = pIVar2->KeysDown;
  local_24 = 0;
  std::fill<bool*,int>
            ((bool *)CONCAT44(in_stack_ffffffffffffff24,
                              CONCAT13(in_stack_ffffffffffffff23,
                                       CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)
                                      )),
             (bool *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(int *)0x106626);
  pIVar2 = ImGui::GetIO();
  pIVar2->KeyCtrl = false;
  pIVar2 = ImGui::GetIO();
  pIVar2->KeyShift = false;
  while (iVar1 = wgetch(_stdscr), local_28 = iVar1, iVar1 != -1) {
    if (iVar1 == 0x199) {
      iVar1 = getmouse(local_3c);
      if (iVar1 == 0) {
        ImTui_ImplNcurses_NewFrame::mx = local_38;
        ImTui_ImplNcurses_NewFrame::my = local_34;
        ImTui_ImplNcurses_NewFrame::mstate = (unsigned_long)local_2c;
        if ((ImTui_ImplNcurses_NewFrame::mstate & 0xf) == 2) {
          ImTui_ImplNcurses_NewFrame::lbut = 1;
        }
        if ((ImTui_ImplNcurses_NewFrame::mstate & 0xf) == 1) {
          ImTui_ImplNcurses_NewFrame::lbut = 0;
        }
        if ((ImTui_ImplNcurses_NewFrame::mstate & 0xf000) == 0x2000) {
          ImTui_ImplNcurses_NewFrame::rbut = 1;
        }
        if ((ImTui_ImplNcurses_NewFrame::mstate & 0xf000) == 0x1000) {
          ImTui_ImplNcurses_NewFrame::rbut = 0;
        }
        uVar3 = ImTui_ImplNcurses_NewFrame::mstate & 0xf000000;
        pIVar2 = ImGui::GetIO();
        pIVar2->KeyCtrl = (pIVar2->KeyCtrl & 1U) != 0 || uVar3 == 0x1000000;
      }
    }
    else {
      ImTui_ImplNcurses_NewFrame::input[0] = (char)iVar1;
      ImTui_ImplNcurses_NewFrame::input[1] = (char)((uint)iVar1 >> 8);
      if ((iVar1 < 0x7f) && (pIVar2 = ImGui::GetIO(), iVar1 != pIVar2->KeyMap[0xd])) {
        ImGui::GetIO();
        ImGuiIO::AddInputCharactersUTF8(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      if (local_28 == 0x14a) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[10]] = true;
      }
      else if (((local_28 == 0x107) || (local_28 == 0x14a)) || (local_28 == 0x7f)) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[0xb]] = true;
      }
      else if (local_28 == 0x189) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[1]] = true;
        pIVar2 = ImGui::GetIO();
        pIVar2->KeyShift = true;
      }
      else if (local_28 == 0x192) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[2]] = true;
        pIVar2 = ImGui::GetIO();
        pIVar2->KeyShift = true;
      }
      else if (local_28 == 0x151) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[3]] = true;
        pIVar2 = ImGui::GetIO();
        pIVar2->KeyShift = true;
      }
      else if (local_28 == 0x150) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[4]] = true;
        pIVar2 = ImGui::GetIO();
        pIVar2->KeyShift = true;
      }
      else if (local_28 == 0x107) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[0xb]] = true;
      }
      else if (local_28 == 0x104) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[1]] = true;
      }
      else if (local_28 == 0x105) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[2]] = true;
      }
      else if (local_28 == 0x103) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[3]] = true;
      }
      else if (local_28 == 0x102) {
        pIVar2 = ImGui::GetIO();
        pIVar4 = ImGui::GetIO();
        pIVar2->KeysDown[pIVar4->KeyMap[4]] = true;
      }
      else {
        local_20[local_28] = true;
      }
    }
    local_1 = 1;
  }
  if ((ImTui_ImplNcurses_NewFrame::mstate & 0xf) == 1) {
    ImTui_ImplNcurses_NewFrame::lbut = 0;
    ImTui_ImplNcurses_NewFrame::rbut = 0;
  }
  pIVar2 = ImGui::GetIO();
  pIVar4 = ImGui::GetIO();
  if ((pIVar2->KeysDown[pIVar4->KeyMap[0x10]] & 1U) != 0) {
    pIVar2 = ImGui::GetIO();
    pIVar2->KeyCtrl = true;
  }
  pIVar2 = ImGui::GetIO();
  pIVar4 = ImGui::GetIO();
  if ((pIVar2->KeysDown[pIVar4->KeyMap[0x11]] & 1U) != 0) {
    pIVar2 = ImGui::GetIO();
    pIVar2->KeyCtrl = true;
  }
  pIVar2 = ImGui::GetIO();
  pIVar4 = ImGui::GetIO();
  if ((pIVar2->KeysDown[pIVar4->KeyMap[0x12]] & 1U) != 0) {
    pIVar2 = ImGui::GetIO();
    pIVar2->KeyCtrl = true;
  }
  pIVar2 = ImGui::GetIO();
  pIVar4 = ImGui::GetIO();
  if ((pIVar2->KeysDown[pIVar4->KeyMap[0x13]] & 1U) != 0) {
    pIVar2 = ImGui::GetIO();
    pIVar2->KeyCtrl = true;
  }
  pIVar2 = ImGui::GetIO();
  pIVar4 = ImGui::GetIO();
  if ((pIVar2->KeysDown[pIVar4->KeyMap[0x14]] & 1U) != 0) {
    pIVar4 = ImGui::GetIO();
    pIVar4->KeyCtrl = true;
  }
  pIVar4 = ImGui::GetIO();
  pIVar5 = ImGui::GetIO();
  if ((pIVar4->KeysDown[pIVar5->KeyMap[0x15]] & 1U) != 0) {
    pIVar4 = ImGui::GetIO();
    pIVar4->KeyCtrl = true;
  }
  fVar7 = (float)ImTui_ImplNcurses_NewFrame::mx;
  pIVar4 = ImGui::GetIO();
  (pIVar4->MousePos).x = fVar7;
  fVar7 = (float)ImTui_ImplNcurses_NewFrame::my;
  pIVar4 = ImGui::GetIO();
  (pIVar4->MousePos).y = fVar7;
  bVar6 = ImTui_ImplNcurses_NewFrame::lbut != 0;
  pIVar4 = ImGui::GetIO();
  pIVar4->MouseDown[0] = (bool)(bVar6 & 1);
  bVar6 = ImTui_ImplNcurses_NewFrame::rbut != 0;
  pIVar4 = ImGui::GetIO();
  pIVar4->MouseDown[1] = (bool)(bVar6 & 1);
  fVar7 = anon_unknown.dwarf_7c8::VSync::delta_s((VSync *)pIVar2);
  pIVar2 = ImGui::GetIO();
  pIVar2->DeltaTime = fVar7;
  return (bool)(local_1 & 1);
}

Assistant:

bool ImTui_ImplNcurses_NewFrame() {
    bool hasInput = false;

	int screenSizeX = 0;
	int screenSizeY = 0;

	getmaxyx(stdscr, screenSizeY, screenSizeX);
	ImGui::GetIO().DisplaySize = ImVec2(screenSizeX, screenSizeY);

    static int mx = 0;
    static int my = 0;
    static int lbut = 0;
    static int rbut = 0;
    static unsigned long mstate = 0;
    static char input[3];

    input[2] = 0;

    auto & keysDown = ImGui::GetIO().KeysDown;
    std::fill(keysDown, keysDown + 512, 0);

    ImGui::GetIO().KeyCtrl = false;
    ImGui::GetIO().KeyShift = false;

    while (true) {
        int c = wgetch(stdscr);

        if (c == ERR) {
            if ((mstate & 0xf) == 0x1) {
                lbut = 0;
                rbut = 0;
            }
            break;
        } else if (c == KEY_MOUSE) {
            MEVENT event;
            if (getmouse(&event) == OK) {
                mx = event.x;
                my = event.y;
                mstate = event.bstate;
                if ((mstate & 0x000f) == 0x0002) lbut = 1;
                if ((mstate & 0x000f) == 0x0001) lbut = 0;
                if ((mstate & 0xf000) == 0x2000) rbut = 1;
                if ((mstate & 0xf000) == 0x1000) rbut = 0;
                //printf("mstate = 0x%016lx\n", mstate);
                ImGui::GetIO().KeyCtrl |= ((mstate & 0x0F000000) == 0x01000000);
            }
        } else {
            input[0] = (c & 0x000000FF);
            input[1] = (c & 0x0000FF00) >> 8;
            //printf("c = %d, c0 = %d, c1 = %d xxx\n", c, input[0], input[1]);
            if (c < 127) {
                if (c != ImGui::GetIO().KeyMap[ImGuiKey_Enter]) {
                    ImGui::GetIO().AddInputCharactersUTF8(input);
                }
            }
            if (c == 330) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Delete]] = true;
            } else if (c == KEY_BACKSPACE || c == KEY_DC || c == 127) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Backspace]] = true;
            // Shift + arrows (probably not portable :()
            } else if (c == 393) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 402) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 337) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 336) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == KEY_BACKSPACE) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Backspace]] = true;
            } else if (c == KEY_LEFT) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]] = true;
            } else if (c == KEY_RIGHT) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]] = true;
            } else if (c == KEY_UP) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]] = true;
            } else if (c == KEY_DOWN) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]] = true;
            } else {
                keysDown[c] = true;
            }
        }

        hasInput = true;
    }

    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_A]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_C]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_V]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_X]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Y]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Z]]) ImGui::GetIO().KeyCtrl = true;

    ImGui::GetIO().MousePos.x = mx;
    ImGui::GetIO().MousePos.y = my;
    ImGui::GetIO().MouseDown[0] = lbut;
    ImGui::GetIO().MouseDown[1] = rbut;

    ImGui::GetIO().DeltaTime = g_vsync.delta_s();

    return hasInput;
}